

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinifyImportsAndExports.cpp
# Opt level: O3

void __thiscall wasm::MinifyImportsAndExports::run(MinifyImportsAndExports *this,Module *module)

{
  pointer puVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range3;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  pointer puVar4;
  anon_class_16_2_bbb8411c visitor;
  undefined1 local_c8 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  oldToNew;
  anon_class_24_3_374d5397 process;
  MinifiedNameGenerator names;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  newToOld;
  char cStack_31;
  
  process.oldToNew =
       (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
        *)&process.newToOld;
  process.newToOld =
       (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
        *)0x0;
  oldToNew._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&oldToNew;
  oldToNew._M_t._M_impl._0_4_ = 0;
  oldToNew._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  oldToNew._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  oldToNew._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  newToOld._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&newToOld;
  newToOld._M_t._M_impl._0_4_ = 0;
  newToOld._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  newToOld._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  newToOld._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  oldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_c8;
  process.names = &names;
  visitor.process = (anon_class_24_3_374d5397 *)process.oldToNew;
  visitor.this = (MinifyImportsAndExports *)
                 &oldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count;
  oldToNew._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       oldToNew._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  newToOld._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       newToOld._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  wasm::ModuleUtils::
  iterImports<wasm::MinifyImportsAndExports::run(wasm::Module*)::_lambda(wasm::Importable*)_1_>
            ((ModuleUtils *)module,(Module *)this,visitor);
  if (this->minifyExports == true) {
    puVar4 = (module->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (module->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar4 != puVar1) {
      do {
        run::anon_class_24_3_374d5397::operator()
                  ((anon_class_24_3_374d5397 *)
                   &oldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &((puVar4->_M_t).
                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                     super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->name);
        puVar4 = puVar4 + 1;
      } while (puVar4 != puVar1);
    }
  }
  Module::updateMaps(module);
  newToOld._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)module;
  if (newToOld._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&newToOld) {
    p_Var3 = newToOld._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)p_Var3[1]._M_right,(long)p_Var3[1]._M_left);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," => ",4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)p_Var3[1]._M_parent,*(long *)(p_Var3 + 1));
      cStack_31 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&cStack_31,1);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)&newToOld);
  }
  if (this->minifyModules != false) {
    doMinifyModules(this,(Module *)newToOld._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)&names);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_c8);
  return;
}

Assistant:

void run(Module* module) override {
    // Minify the imported names.
    Names::MinifiedNameGenerator names;
    std::map<Name, Name> oldToNew;
    std::map<Name, Name> newToOld;
    auto process = [&](Name& name) {
      auto iter = oldToNew.find(name);
      if (iter == oldToNew.end()) {
        auto newName = names.getName();
        oldToNew[name] = newName;
        newToOld[newName] = name;
        name = newName;
      } else {
        name = iter->second;
      }
    };
    ModuleUtils::iterImports(*module, [&](Importable* curr) {
      // Minify all import base names if we are importing modules (which means
      // we will minify all modules names, so we are not being careful).
      // Otherwise, assume we just want to minify "normal" imports like env
      // and wasi, but not custom user things.
      if (minifyModules || curr->module == ENV ||
          curr->module.startsWith("wasi_")) {
        process(curr->base);
      }
    });

    if (minifyExports) {
      // Minify the exported names.
      for (auto& curr : module->exports) {
        process(curr->name);
      }
    }
    module->updateMaps();
    // Emit the mapping.
    for (auto& [new_, old] : newToOld) {
      std::cout << old.str << " => " << new_.str << '\n';
    }

    if (minifyModules) {
      doMinifyModules(module);
    }
  }